

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatrices
          (EigenDecompositionCube<double,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,double **transitionMatrices,int count)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  long in_stack_00000008;
  int k_2;
  double sumD2;
  double sumD1_1;
  double sum_2;
  int j_2;
  int i_5;
  int m_1;
  double scaledEigenValue_1;
  int i_4;
  int l_2;
  int n_2;
  double *secondDerivMat;
  double *firstDerivMat_1;
  double *transitionMat_2;
  int u_2;
  int k_1;
  double sumD1;
  double sum_1;
  int j_1;
  int i_3;
  int m;
  double scaledEigenValue;
  int i_2;
  int l_1;
  int n_1;
  double *firstDerivMat;
  double *transitionMat_1;
  int u_1;
  int k;
  double sum;
  int j;
  int i_1;
  double *tmpCMatrices;
  int i;
  int l;
  int n;
  double *transitionMat;
  int u;
  int stateCountModFour;
  undefined4 local_11c;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_38;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  if ((in_RCX == 0) && (in_R8 == 0)) {
    for (local_38 = 0; local_38 < sumD1_1._0_4_; local_38 = local_38 + 1) {
      lVar2 = *(long *)((long)sumD2 + (long)*(int *)(in_RDX + (long)local_38 * 4) * 8);
      local_44 = 0;
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x18); local_48 = local_48 + 1) {
        for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x10); local_4c = local_4c + 1) {
          dVar5 = exp(*(double *)
                       (*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) + (long)local_4c * 8) *
                      *(double *)(in_R9 + (long)local_38 * 8) *
                      *(double *)(in_stack_00000008 + (long)local_48 * 8));
          *(double *)(*(long *)(in_RDI + 0x28) + (long)local_4c * 8) = dVar5;
        }
        local_58 = *(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8);
        for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x10); local_5c = local_5c + 1) {
          for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x10); local_60 = local_60 + 1) {
            local_68 = 0.0;
            for (local_6c = 0; local_6c < iVar1 / 4 << 2; local_6c = local_6c + 4) {
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)(local_58 + (long)local_6c * 8);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)local_6c * 8);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = local_68;
              auVar14 = vfmadd213sd_fma(auVar7,auVar17,auVar27);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *(ulong *)(local_58 + (long)(local_6c + 1) * 8);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)(local_6c + 1) * 8);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = auVar14._0_8_;
              auVar14 = vfmadd213sd_fma(auVar8,auVar18,auVar28);
              auVar19._8_8_ = 0;
              auVar19._0_8_ = *(ulong *)(local_58 + (long)(local_6c + 2) * 8);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)(local_6c + 2) * 8);
              auVar29._8_8_ = 0;
              auVar29._0_8_ = auVar14._0_8_;
              auVar14 = vfmadd213sd_fma(auVar9,auVar19,auVar29);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = *(ulong *)(local_58 + (long)(local_6c + 3) * 8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)(local_6c + 3) * 8);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = auVar14._0_8_;
              auVar14 = vfmadd213sd_fma(auVar10,auVar20,auVar30);
              local_68 = auVar14._0_8_;
            }
            for (; local_6c < *(int *)(in_RDI + 0x10); local_6c = local_6c + 1) {
              auVar21._8_8_ = 0;
              auVar21._0_8_ = *(ulong *)(local_58 + (long)local_6c * 8);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)local_6c * 8);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = local_68;
              auVar14 = vfmadd213sd_fma(auVar11,auVar21,auVar31);
              local_68 = auVar14._0_8_;
            }
            local_58 = local_58 + (long)*(int *)(in_RDI + 0x10) * 8;
            if (local_68 <= 0.0) {
              *(undefined8 *)(lVar2 + (long)local_44 * 8) = 0;
            }
            else {
              *(double *)(lVar2 + (long)local_44 * 8) = local_68;
            }
            local_44 = local_44 + 1;
          }
          *(undefined8 *)(lVar2 + (long)local_44 * 8) = 0x3ff0000000000000;
          local_44 = local_44 + 1;
        }
      }
    }
  }
  else if (in_R8 == 0) {
    for (local_70 = 0; local_70 < sumD1_1._0_4_; local_70 = local_70 + 1) {
      lVar2 = *(long *)((long)sumD2 + (long)*(int *)(in_RDX + (long)local_70 * 4) * 8);
      lVar3 = *(long *)((long)sumD2 + (long)*(int *)(in_RCX + (long)local_70 * 4) * 8);
      local_84 = 0;
      for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x18); local_88 = local_88 + 1) {
        for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x10); local_8c = local_8c + 1) {
          dVar5 = *(double *)
                   (*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) + (long)local_8c * 8) *
                  *(double *)(in_stack_00000008 + (long)local_88 * 8);
          dVar6 = exp(dVar5 * *(double *)(in_R9 + (long)local_70 * 8));
          *(double *)(*(long *)(in_RDI + 0x28) + (long)local_8c * 8) = dVar6;
          *(double *)(*(long *)(in_RDI + 0x30) + (long)local_8c * 8) =
               dVar5 * *(double *)(*(long *)(in_RDI + 0x28) + (long)local_8c * 8);
        }
        local_9c = 0;
        for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x10); local_a0 = local_a0 + 1) {
          for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x10); local_a4 = local_a4 + 1) {
            local_b0 = 0.0;
            local_b8 = 0;
            for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x10); local_bc = local_bc + 1) {
              auVar22._8_8_ = 0;
              auVar22._0_8_ =
                   *(ulong *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8) +
                             (long)local_9c * 8);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)local_bc * 8);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_b0;
              auVar14 = vfmadd213sd_fma(auVar12,auVar22,auVar32);
              local_b0 = auVar14._0_8_;
              auVar23._8_8_ = 0;
              auVar23._0_8_ =
                   *(ulong *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8) +
                             (long)local_9c * 8);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x30) + (long)local_bc * 8);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_b8;
              auVar14 = vfmadd213sd_fma(auVar13,auVar23,auVar33);
              local_b8 = auVar14._0_8_;
              local_9c = local_9c + 1;
            }
            if (local_b0 <= 0.0) {
              *(undefined8 *)(lVar2 + (long)local_84 * 8) = 0;
            }
            else {
              *(double *)(lVar2 + (long)local_84 * 8) = local_b0;
            }
            *(ulong *)(lVar3 + (long)local_84 * 8) = local_b8;
            local_84 = local_84 + 1;
          }
          *(undefined8 *)(lVar2 + (long)local_84 * 8) = 0x3ff0000000000000;
          *(undefined8 *)(lVar3 + (long)local_84 * 8) = 0;
          local_84 = local_84 + 1;
        }
      }
    }
  }
  else {
    for (local_c0 = 0; local_c0 < sumD1_1._0_4_; local_c0 = local_c0 + 1) {
      lVar2 = *(long *)((long)sumD2 + (long)*(int *)(in_RDX + (long)local_c0 * 4) * 8);
      lVar3 = *(long *)((long)sumD2 + (long)*(int *)(in_RCX + (long)local_c0 * 4) * 8);
      lVar4 = *(long *)((long)sumD2 + (long)*(int *)(in_R8 + (long)local_c0 * 4) * 8);
      local_dc = 0;
      for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x18); local_e0 = local_e0 + 1) {
        for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0x10); local_e4 = local_e4 + 1) {
          dVar5 = *(double *)
                   (*(long *)(*(long *)(in_RDI + 8) + (long)in_ESI * 8) + (long)local_e4 * 8) *
                  *(double *)(in_stack_00000008 + (long)local_e0 * 8);
          dVar6 = exp(dVar5 * *(double *)(in_R9 + (long)local_c0 * 8));
          *(double *)(*(long *)(in_RDI + 0x28) + (long)local_e4 * 8) = dVar6;
          *(double *)(*(long *)(in_RDI + 0x30) + (long)local_e4 * 8) =
               dVar5 * *(double *)(*(long *)(in_RDI + 0x28) + (long)local_e4 * 8);
          *(double *)(*(long *)(in_RDI + 0x38) + (long)local_e4 * 8) =
               dVar5 * *(double *)(*(long *)(in_RDI + 0x30) + (long)local_e4 * 8);
        }
        local_f4 = 0;
        for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x10); local_f8 = local_f8 + 1) {
          for (local_fc = 0; local_fc < *(int *)(in_RDI + 0x10); local_fc = local_fc + 1) {
            local_108 = 0.0;
            local_110 = 0;
            local_118 = 0;
            for (local_11c = 0; local_11c < *(int *)(in_RDI + 0x10); local_11c = local_11c + 1) {
              auVar24._8_8_ = 0;
              auVar24._0_8_ =
                   *(ulong *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8) +
                             (long)local_f4 * 8);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x28) + (long)local_11c * 8);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = local_108;
              auVar14 = vfmadd213sd_fma(auVar14,auVar24,auVar34);
              local_108 = auVar14._0_8_;
              auVar25._8_8_ = 0;
              auVar25._0_8_ =
                   *(ulong *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8) +
                             (long)local_f4 * 8);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x30) + (long)local_11c * 8);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = local_110;
              auVar14 = vfmadd213sd_fma(auVar15,auVar25,auVar35);
              local_110 = auVar14._0_8_;
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   *(ulong *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)in_ESI * 8) +
                             (long)local_f4 * 8);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x38) + (long)local_11c * 8);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_118;
              auVar14 = vfmadd213sd_fma(auVar16,auVar26,auVar36);
              local_118 = auVar14._0_8_;
              local_f4 = local_f4 + 1;
            }
            if (local_108 <= 0.0) {
              *(undefined8 *)(lVar2 + (long)local_dc * 8) = 0;
            }
            else {
              *(double *)(lVar2 + (long)local_dc * 8) = local_108;
            }
            *(ulong *)(lVar3 + (long)local_dc * 8) = local_110;
            *(ulong *)(lVar4 + (long)local_dc * 8) = local_118;
            local_dc = local_dc + 1;
          }
          *(undefined8 *)(lVar2 + (long)local_dc * 8) = 0x3ff0000000000000;
          *(undefined8 *)(lVar3 + (long)local_dc * 8) = 0;
          *(undefined8 *)(lVar4 + (long)local_dc * 8) = 0;
          local_dc = local_dc + 1;
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}